

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O1

void __thiscall tt::Logger::~Logger(Logger *this)

{
  Buffer *logline;
  char **ppcVar1;
  char *pcVar2;
  size_t __n;
  pointer pcVar3;
  LogStream *pLVar4;
  char **ppcVar5;
  int iVar6;
  
  ppcVar5 = &(this->m_impl).m_stream.m_buffer.m_cur;
  pcVar2 = (this->m_impl).m_stream.m_buffer.m_cur;
  iVar6 = (int)ppcVar5;
  if (2 < iVar6 - (int)pcVar2) {
    pcVar2[0] = '-';
    pcVar2[1] = '-';
    *ppcVar5 = *ppcVar5 + 2;
  }
  pcVar2 = (this->m_impl).m_stream.m_buffer.m_cur;
  __n = (this->m_impl).m_basename._M_string_length;
  if ((int)__n < iVar6 - (int)pcVar2) {
    memcpy(pcVar2,(this->m_impl).m_basename._M_dataplus._M_p,__n);
    ppcVar1 = &(this->m_impl).m_stream.m_buffer.m_cur;
    *ppcVar1 = *ppcVar1 + __n;
  }
  pcVar2 = *ppcVar5;
  if (3 < iVar6 - (int)pcVar2) {
    pcVar2[2] = ' ';
    pcVar2[0] = ' ';
    pcVar2[1] = ':';
    *ppcVar5 = *ppcVar5 + 3;
  }
  pLVar4 = LogStream::operator<<((LogStream *)this,(this->m_impl).m_line);
  ppcVar5 = &(pLVar4->m_buffer).m_cur;
  pcVar2 = (pLVar4->m_buffer).m_cur;
  if (1 < (int)ppcVar5 - (int)pcVar2) {
    *pcVar2 = '\n';
    *ppcVar5 = *ppcVar5 + 1;
  }
  pcVar2 = (this->m_impl).m_stream.m_buffer.m_cur;
  pthread_once(&once_control_,once_init);
  logline = &(this->m_impl).m_stream.m_buffer;
  AsyncLogging::append(AsyncLogger_,logline->m_data,(int)pcVar2 - (int)logline);
  pcVar3 = (this->m_impl).m_basename._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->m_impl).m_basename.field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

Logger::~Logger(){
	
	m_impl.m_stream << "--" << m_impl.m_basename << " : " 
		<< m_impl.m_line << "\n";
	
	const LogStream::Buffer& buf(stream().buffer());

	output(buf.data(), buf.length());
}